

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O1

_Bool borg_flow_old(wchar_t why)

{
  borg_grid *pbVar1;
  borg_take *pbVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  ushort uVar6;
  bool bVar7;
  loc_conflict grid2;
  chunk_conflict *pcVar8;
  _Bool _Var9;
  uint32_t uVar10;
  long lVar14;
  loc_conflict lVar15;
  uint uVar11;
  wchar_t wVar12;
  uint32_t uVar13;
  char *pcVar16;
  char *pcVar17;
  loc lVar18;
  object *poVar19;
  loc_conflict lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  keycode_t kVar24;
  wchar_t wVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  uint32_t uVar30;
  int iVar31;
  borg_kill *pbVar32;
  long lVar33;
  wchar_t y2;
  ulong local_38;
  
  if (borg.goal.type != why) {
    return false;
  }
  bVar3 = borg_data_flow->data[borg.c.y][borg.c.x];
  iVar27 = ((uint)bVar3 + (uint)bVar3 * 4) * 2 + -5;
  local_38 = 0xffffffff;
  uVar26 = 0;
  uVar13 = 0;
  do {
    sVar4 = ddx_ddd[uVar26];
    lVar21 = (long)borg.c.x + (long)sVar4;
    sVar5 = ddy_ddd[uVar26];
    lVar14 = (long)borg.c.y + (long)sVar5;
    iVar31 = (uint)borg_data_flow->data[lVar14][lVar21] * 10;
    if (((iVar31 <= iVar27) && (0xffffff3a < (int)lVar21 - 0xc6U)) &&
       (0xffffffbe < (int)lVar14 - 0x42U)) {
      uVar30 = uVar13;
      if (iVar31 < iVar27) {
        uVar30 = 0;
      }
      if ((((borg.trait[0x69] != 0) ||
           (uVar13 = uVar30 + 1, bVar7 = (int)uVar30 < 1, uVar30 = uVar13, bVar7)) ||
          (uVar10 = Rand_div(uVar13), uVar10 == 0)) &&
         ((uVar13 = uVar30, borg.trait[0x69] < 1 || (uVar13 = uVar30 + 1, (int)uVar30 < 1)))) {
        if ((borg.goal.type == 10) && (sVar4 == 0 || sVar5 == 0)) {
          lVar15 = loc((uint)borg_flow_x[0],(uint)borg_flow_y[0]);
          lVar20.y = borg.c.y;
          lVar20.x = borg.c.x;
          wVar25 = distance(lVar20,lVar15);
          if (wVar25 < L'\x03') goto LAB_00221b08;
        }
        local_38 = uVar26 & 0xffffffff;
        iVar27 = iVar31;
      }
    }
LAB_00221b08:
    uVar26 = uVar26 + 1;
  } while (uVar26 != 8);
  if ((int)local_38 < 0) goto LAB_00221dc0;
  wVar25 = ddx_ddd[local_38] + borg.c.x;
  if (breeder_level == true) {
    iVar27 = 0;
    uVar28 = 0xffffffffffffffff;
    uVar26 = 0;
    uVar22 = 0;
    do {
      lVar14 = uVar28 + (long)borg.c.x;
      uVar29 = 0xffffffffffffffff;
      do {
        if (((int)uVar29 != 0 || (int)uVar28 != 0) &&
           (borg_grids[(long)borg.c.y + uVar29][lVar14].feat == '\x03')) {
          if ((borg_grids[(long)borg.c.y + uVar29][lVar14].kill == '\0') &&
             ((track_door.num < 0xff &&
              ((int)ddy_ddd[local_38] != (int)uVar29 || wVar25 != (wchar_t)lVar14)))) {
            iVar27 = iVar27 + 1;
            uVar22 = uVar29 & 0xffffffff;
            uVar26 = uVar28 & 0xffffffff;
          }
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != 2);
      uVar28 = uVar28 + 1;
    } while (uVar28 != 2);
    if (iVar27 != 0) {
      wVar25 = borg_goto_dir(borg.c.y,borg.c.x,(int)uVar22 + borg.c.y,(int)uVar26 + borg.c.x);
      iVar27 = ddx[wVar25] + borg.c.x;
      iVar31 = ddy[wVar25] + borg.c.y;
      borg.goal.g.x = iVar27;
      borg.goal.g.y = iVar31;
      borg_note("# Closing a door");
      borg_keypress(99);
      borg_queue_direction(wVar25 + L'0');
      uVar11 = (uint)track_door.num;
      if ((int)uVar11 < 1) {
        uVar23 = 0;
      }
      else {
        uVar26 = 0;
        do {
          if ((track_door.x[uVar26] == iVar27) && (track_door.y[uVar26] == iVar31)) {
            return true;
          }
          uVar26 = uVar26 + 1;
          uVar23 = uVar11;
        } while (uVar11 != uVar26);
      }
      if (uVar23 != uVar11) {
        return true;
      }
      if ((int)uVar23 < (int)track_door.size) {
        borg_note("# Noting the closing of a door.");
        track_door.num = track_door.num + 1;
        track_door.x[uVar23] = iVar27;
        track_door.y[uVar23] = iVar31;
        return true;
      }
      return true;
    }
  }
  if (((borg.goal.less == true) && (borg_grids[borg.c.y][borg.c.x].feat == '\x05')) &&
     ((player->opts).opt[0x20] == false)) {
    borg.goal.less = false;
    kVar24 = 0x3c;
    goto LAB_0022259a;
  }
  y2 = ddy_ddd[local_38] + borg.c.y;
  wVar12 = borg_goto_dir(borg.c.y,borg.c.x,y2,wVar25);
  pbVar32 = borg_kills;
  if (wVar12 == L'\x05') goto LAB_00221dc0;
  lVar14 = (long)ddx[wVar12] + (long)borg.c.x;
  borg.goal.g.x = (int)lVar14;
  borg.goal.g.y = (int)((long)ddy[wVar12] + (long)borg.c.y);
  uVar26 = (ulong)borg_grids[(long)ddy[wVar12] + (long)borg.c.y][lVar14].kill;
  if (uVar26 == 0) {
    pbVar1 = borg_grids[(long)ddy[wVar12] + (long)borg.c.y] + lVar14;
    uVar26 = (ulong)pbVar1->take;
    if ((uVar26 == 0) || (borg_takes[uVar26].kind == (object_kind *)0x0)) {
      if (pbVar1->glyph == true) {
        pcVar16 = format("# Walking onto a glyph of warding.");
      }
      else {
        if (((borg.trait[0x1a] != 0) && (borg.trait[0x70] == 0)) &&
           ((borg.trait[0x72] == 0 && ((scaryguy_on_level == false && (pbVar1->trap == true)))))) {
          _Var9 = borg_activate_item(act_disable_traps);
          if (_Var9) {
            borg_note("# Activation to Disable Traps, Destroy Doors");
            pbVar1->trap = false;
            borg.no_rest_prep = 3000;
            lVar15.y = borg.goal.g.y;
            lVar15.x = borg.goal.g.x;
            borg_target(lVar15);
            return true;
          }
          if (((borg.trait[0x1f] << 2) / 5 < borg.trait[0x1e]) &&
             (_Var9 = borg_spell(DISABLE_TRAPS_DESTROY_DOORS), _Var9)) {
            borg_note("# Disable Traps, Destroy Doors");
            pbVar1->trap = false;
            borg.no_rest_prep = 3000;
            return true;
          }
          borg_note("# Disarming a trap");
          borg_keypress(0x44);
          borg_queue_direction(wVar12 + L'0');
          pbVar1->trap = false;
          return true;
        }
        bVar3 = pbVar1->feat;
        wVar25 = (wchar_t)bVar3;
        if (bVar3 == 0x17) {
          if (borg.trait[0x40] == 0) goto LAB_00221dc0;
        }
        else {
          if (bVar3 == 0x16) goto LAB_00221dc0;
          if (wVar25 == L'\x02') {
            uVar13 = Rand_div(100);
            if (uVar13 == 0) goto LAB_00221dc0;
            lVar14 = 0;
            do {
              if (((borg_grids[(long)ddy_ddd[lVar14] + (long)borg.c.y]
                    [(long)ddx_ddd[lVar14] + (long)borg.c.x].kill != '\0') &&
                  (borg.trait[0x23] < 0xf)) && (borg.trait[0x71] == 0)) goto LAB_00221dc0;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 8);
            uVar13 = Rand_div(100);
            if ((uVar13 == 0) || (499 < borg.time_this_panel)) {
              _Var9 = borg_spell(DISABLE_TRAPS_DESTROY_DOORS);
              if ((_Var9) || (_Var9 = borg_activate_item(act_destroy_doors), _Var9)) {
                borg_note("# Disable Traps, Destroy Doors");
                return true;
              }
              _Var9 = borg_spell(TURN_STONE_TO_MUD);
              if (((_Var9) || (_Var9 = borg_spell(SHATTER_STONE), _Var9)) ||
                 ((_Var9 = borg_activate_ring(sv_ring_digging), _Var9 ||
                  (_Var9 = borg_activate_item(act_stone_to_mud), _Var9)))) {
                borg_note("# Melting a door");
                borg_keypress(wVar12 + L'0');
                goto LAB_002223d3;
              }
            }
            if (my_need_alter == true) {
              borg_keypress(0x2b);
              my_need_alter = false;
            }
            else {
              borg_note("# Opening a door");
              borg_keypress(0x6f);
            }
            borg_queue_direction(wVar12 + L'0');
LAB_002223d3:
            if (track_closed.num != 0) {
              track_closed.num = 0;
              return true;
            }
            return true;
          }
        }
        if ((byte)(bVar3 - 0xf) < 7) {
          if ((wVar25 == L'\x10') || (borg.goal.type != 4)) {
            _Var9 = borg_can_dig(false,bVar3);
            if (_Var9) {
              _Var9 = borg_spell(TURN_STONE_TO_MUD);
              if ((((_Var9) || (_Var9 = borg_spell(SHATTER_STONE), _Var9)) ||
                  (_Var9 = borg_activate_ring(sv_ring_digging), _Var9)) ||
                 (_Var9 = borg_activate_item(act_stone_to_mud), _Var9)) {
                borg_note("# Melting a wall/etc");
              }
              else {
                uVar13 = Rand_div(500);
                if (((int)uVar13 < 6) && (vault_on_level != true)) goto LAB_00221dc0;
                borg_note("# Digging through wall/etc");
                borg_keypress(0x54);
              }
              borg_keypress(wVar12 + L'0');
              track_vein.num = 0;
              return true;
            }
            borg.goal.type = 0;
          }
          goto LAB_00221dc0;
        }
        _Var9 = feat_is_shop(wVar25);
        if (!_Var9) {
          if (my_need_alter == true) {
            borg_keypress(0x2b);
            my_need_alter = false;
          }
          borg_keypress(wVar12 + L'0');
          borg.in_shop = false;
          return true;
        }
        pcVar16 = format("# Entering a \'%d\' shop",(ulong)pbVar1->store);
      }
      borg_note(pcVar16);
    }
    else {
      pbVar2 = borg_takes + uVar26;
      pcVar16 = (borg_takes[uVar26].kind)->name;
      pcVar17 = strstr(pcVar16,"chest");
      if ((pcVar17 != (char *)0x0) &&
         (pcVar16 = strstr(pcVar16,"Ruined"), pcVar8 = cave, pcVar16 == (char *)0x0)) {
        lVar18 = (loc)loc(wVar25,y2);
        poVar19 = borg_get_top_object((chunk_conflict1 *)pcVar8,lVar18);
        if (poVar19 == (object *)0x0) {
          borg_delete_take((uint)pbVar1->take);
          bVar7 = false;
          poVar19 = (object *)0x0;
        }
        else {
          sVar4 = poVar19->pval;
          if (((sVar4 < 2) || (poVar19->known == (object *)0x0)) ||
             (borg.trait[0x38] - (int)sVar4 < borg_cfg[0x16])) {
            if ((-1 < sVar4) && (poVar19->known != (object *)0x0)) {
              bVar7 = true;
              goto LAB_0022242f;
            }
            pcVar16 = format("# Opening a \'%s\' at (%d,%d)",pbVar2->kind->name,(ulong)pbVar2->y,
                             (ulong)pbVar2->x);
            borg_note(pcVar16);
            kVar24 = 0x6f;
          }
          else {
            pcVar16 = format("# Disarming a \'%s\' at (%d,%d)",pbVar2->kind->name,(ulong)pbVar2->y,
                             (ulong)pbVar2->x);
            borg_note(pcVar16);
            kVar24 = 0x44;
          }
          bVar7 = false;
          borg_keypress(kVar24);
          borg_queue_direction(wVar12 + L'0');
          poVar19 = (object *)0x1;
        }
LAB_0022242f:
        if (!bVar7) {
          if (((ulong)poVar19 & 1) != 0) {
            return true;
          }
LAB_00221dc0:
          if (((borg.goal.type == 10) && (borg.c.y == (uint)borg_flow_y[0])) &&
             (borg.c.x == (uint)borg_flow_x[0])) {
            borg_t_antisummon = (wchar_t)borg_t;
          }
          borg.goal.type = 0;
          return false;
        }
      }
      if ((pbVar2->orbed == false) && ((uint)(pbVar2->tval + L'\xfffffffe') < 0x14)) {
        lVar20 = loc((uint)pbVar2->x,(uint)pbVar2->y);
        grid2.y = borg.c.y;
        grid2.x = borg.c.x;
        wVar25 = distance(lVar20,grid2);
        if ((wVar25 == L'\x01') && (_Var9 = borg_spell_okay_fail(ORB_OF_DRAINING,L'\x19'), _Var9)) {
          lVar20 = loc((uint)pbVar2->x,(uint)pbVar2->y);
          borg_target(lVar20);
          borg_spell(ORB_OF_DRAINING);
          borg_note("# Orbing an object to check for cursed item.");
          borg_keypress(0x35);
          pbVar2->orbed = true;
          lVar14 = 0;
          do {
            pcVar8 = cave;
            lVar21 = (long)*(short *)((long)borg_ddx_ddd + lVar14) + (ulong)pbVar2->x;
            lVar33 = (long)*(short *)((long)borg_ddy_ddd + lVar14) + (ulong)pbVar2->y;
            lVar18 = (loc)loc((int)lVar21,(int)lVar33);
            _Var9 = square_in_bounds_fully(pcVar8,lVar18);
            if ((_Var9) && ((ulong)borg_grids[lVar33][lVar21].take != 0)) {
              borg_takes[borg_grids[lVar33][lVar21].take].orbed = true;
            }
            lVar14 = lVar14 + 2;
          } while (lVar14 != 0x30);
          return true;
        }
      }
      pcVar16 = format("# Walking onto and deleting a \'%s\' at (%d,%d)",pbVar2->kind->name,
                       (ulong)pbVar2->y,(ulong)pbVar2->x);
      borg_note(pcVar16);
      borg_delete_take((uint)pbVar1->take);
    }
  }
  else {
    uVar6 = borg_kills[uVar26].r_idx;
    if (((((uVar6 == 0) || ((int)(z_info->r_max - 1) <= (int)(uint)uVar6)) ||
         (borg.trait[0x71] != 0)) || (borg.trait[0xba] != 0)) ||
       (((_Var9 = flag_has_dbg(r_info[(uint)uVar6].flags,0xb,1,"r_info[kill->r_idx].flags",
                               "RF_UNIQUE"), _Var9 && (borg.trait[0x69] == 0)) &&
        (borg.trait[0x23] < 5)))) goto LAB_00221dc0;
    pbVar32 = pbVar32 + uVar26;
    pcVar16 = borg_race_name((uint)pbVar32->r_idx);
    pcVar16 = format("# Walking into a \'%s\' at (%d,%d)",pcVar16,(ulong)(uint)(pbVar32->pos).y,
                     (ulong)(uint)(pbVar32->pos).x);
    borg_note(pcVar16);
    if (my_no_alter == true) {
      borg_keypress(0x3b);
      my_no_alter = false;
    }
    else {
      borg_keypress(0x2b);
    }
  }
  kVar24 = wVar12 + L'0';
LAB_0022259a:
  borg_keypress(kVar24);
  return true;
}

Assistant:

bool borg_flow_old(int why)
{
    int x, y;

    /* Continue */
    if (borg.goal.type == why) {
        int b_n = 0;

        int i, b_i = -1;

        int c, b_c;

        /* Flow cost of current grid */
        b_c = borg_data_flow->data[borg.c.y][borg.c.x] * 10;

        /* Prevent loops */
        b_c = b_c - 5;

        /* Look around */
        for (i = 0; i < 8; i++) {
            /* Grid in that direction */
            x = borg.c.x + ddx_ddd[i];
            y = borg.c.y + ddy_ddd[i];

            /* Flow cost at that grid */
            c = borg_data_flow->data[y][x] * 10;

            /* Never backtrack */
            if (c > b_c)
                continue;

            /* avoid screen edges */
            if (x > AUTO_MAX_X - 1 || x < 1 || y > AUTO_MAX_Y - 1 || y < 1)
                continue;

            /* Notice new best value */
            if (c < b_c)
                b_n = 0;

            /* Apply the randomizer to equivalent values */
            if (borg.trait[BI_CDEPTH] == 0 && (++b_n >= 2)
                && (randint0(b_n) != 0))
                continue;
            else if (borg.trait[BI_CDEPTH] >= 1 && ++b_n >= 2)
                continue;

            /* Special case when digging anti-summon corridor */
            if (borg.goal.type == GOAL_DIGGING
                && (ddx_ddd[i] == 0 || ddy_ddd[i] == 0)) {
                /* No straight lines */
                if (distance(borg.c, loc(borg_flow_x[0], borg_flow_y[0])) <= 2)
                    continue;
            }

            /* Track it */
            b_i = i;
            b_c = c;
        }

        /* Try it */
        if (b_i >= 0) {
            /* Access the location */
            x = borg.c.x + ddx_ddd[b_i];
            y = borg.c.y + ddy_ddd[b_i];

            /* Attempt motion */
            if (borg_play_step(y, x))
                return true;
        }

        /* Mark a timestamp to wait on a anti-summon spot for a few turns */
        if (borg.goal.type == GOAL_DIGGING && borg.c.y == borg_flow_y[0]
            && borg.c.x == borg_flow_x[0])
            borg_t_antisummon = borg_t;

        /* Cancel goal */
        borg.goal.type = 0;
    }

    /* Nothing to do */
    return false;
}